

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O1

void __thiscall HandleManager::sessionClosed(HandleManager *this,CK_SESSION_HANDLE hSession)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr slotID;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Self __tmp;
  iterator iVar4;
  pair<std::_Rb_tree_iterator<std::pair<void_*const,_unsigned_long>_>,_std::_Rb_tree_iterator<std::pair<void_*const,_unsigned_long>_>_>
  pVar5;
  MutexLocker lock;
  long local_58;
  MutexLocker local_40;
  
  MutexLocker::MutexLocker(&local_40,this->handlesMutex);
  p_Var1 = &(this->handles)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &p_Var1->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[*(ulong *)(p_Var3 + 1) < hSession]) {
    if (*(ulong *)(p_Var3 + 1) >= hSession) {
      p_Var2 = p_Var3;
    }
  }
  iVar4._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var1) &&
     (iVar4._M_node = p_Var2, hSession < *(ulong *)(p_Var2 + 1))) {
    iVar4._M_node = &p_Var1->_M_header;
  }
  if (((_Rb_tree_header *)iVar4._M_node != p_Var1) && (iVar4._M_node[1]._M_parent == (_Base_ptr)0x1)
     ) {
    slotID = iVar4._M_node[1]._M_left;
    std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Handle>,std::_Select1st<std::pair<unsigned_long_const,Handle>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Handle>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,Handle>,std::_Select1st<std::pair<unsigned_long_const,Handle>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Handle>>>
                        *)&this->handles,iVar4);
    iVar4._M_node = (this->handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
      local_58 = 0;
      do {
        if (iVar4._M_node[1]._M_parent == (_Base_ptr)0x2) {
          if (iVar4._M_node[1]._M_right != (_Base_ptr)hSession) goto LAB_00164622;
          pVar5 = std::
                  _Rb_tree<void_*,_std::pair<void_*const,_unsigned_long>,_std::_Select1st<std::pair<void_*const,_unsigned_long>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                  ::equal_range(&(this->objects)._M_t,(key_type *)(iVar4._M_node + 2));
          std::
          _Rb_tree<void_*,_std::pair<void_*const,_unsigned_long>,_std::_Select1st<std::pair<void_*const,_unsigned_long>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
          ::_M_erase_aux(&(this->objects)._M_t,(_Base_ptr)pVar5.first._M_node,
                         (_Base_ptr)pVar5.second._M_node);
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(iVar4._M_node);
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Handle>,std::_Select1st<std::pair<unsigned_long_const,Handle>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Handle>>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,Handle>,std::_Select1st<std::pair<unsigned_long_const,Handle>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Handle>>>
                              *)&this->handles,iVar4);
        }
        else {
          if ((iVar4._M_node[1]._M_parent == (_Base_ptr)0x1) && (slotID == iVar4._M_node[1]._M_left)
             ) {
            local_58 = local_58 + 1;
          }
LAB_00164622:
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(iVar4._M_node);
        }
        iVar4._M_node = p_Var3;
      } while ((_Rb_tree_header *)p_Var3 != p_Var1);
      if (local_58 != 0) goto LAB_0016464b;
    }
    allSessionsClosed(this,(CK_SLOT_ID)slotID,true);
  }
LAB_0016464b:
  MutexLocker::~MutexLocker(&local_40);
  return;
}

Assistant:

void HandleManager::sessionClosed(const CK_SESSION_HANDLE hSession)
{
	CK_SLOT_ID slotID;
	MutexLocker lock(handlesMutex);

	std::map< CK_ULONG, Handle>::iterator it = handles.find(hSession);
	if (it == handles.end() || CKH_SESSION != it->second.kind)
		return; // Unable to find the specified session.

	slotID = it->second.slotID;

	// session closed, so we can erase information about it.
	handles.erase(it);

	// Erase all session object handles associated with the given session handle.
	CK_ULONG openSessionCount = 0;
	for (it = handles.begin(); it != handles.end(); ) {
		Handle &h = it->second;
		if (CKH_SESSION == h.kind && slotID == h.slotID) {
			++openSessionCount; // another session is open for this slotID.
		} else {
			if (CKH_OBJECT == h.kind && hSession == h.hSession) {
				// A session object is present for the given session, so erase it.
				objects.erase(it->second.object);
				// Iterator post-incrementing (it++) will return a copy of the original it (which points to handle to be deleted).
				handles.erase(it++);
				continue;
			}
		}
		++it;
	}

	 // We are done when there are still sessions open.
	if (openSessionCount)
		return;

	// No more sessions open for this token, so remove all object handles that are still valid for the given slotID.
	allSessionsClosed(slotID, true);
}